

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O0

unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> __thiscall
flow::lang::Parser::whileStmt(Parser *this)

{
  Report *this_00;
  bool bVar1;
  SourceLocation *pSVar2;
  FilePos *endPos;
  Parser *in_RSI;
  undefined1 local_a0 [16];
  string local_90;
  unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> local_70;
  unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> body;
  unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> cond;
  undefined1 local_50 [8];
  SourceLocation sloc;
  Parser *this_local;
  
  pSVar2 = location(in_RSI);
  SourceLocation::SourceLocation((SourceLocation *)local_50,pSVar2);
  consume(in_RSI,While);
  expr((Parser *)&body);
  stmt((Parser *)&local_70);
  bVar1 = hasFeature(in_RSI,WhileLoop);
  if (!bVar1) {
    this_00 = in_RSI->report_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"While-loop feature not enabled.",
               (allocator<char> *)(local_a0 + 0xf));
    diagnostics::Report::syntaxError<>(this_00,(SourceLocation *)local_50,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)(local_a0 + 0xf));
  }
  endPos = end(in_RSI);
  pSVar2 = SourceLocation::update((SourceLocation *)local_50,endPos);
  std::
  make_unique<flow::lang::WhileStmt,flow::SourceLocation&,std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,std::unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>>>
            ((SourceLocation *)local_a0,
             (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)pSVar2,&body);
  std::unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>>::
  unique_ptr<flow::lang::WhileStmt,std::default_delete<flow::lang::WhileStmt>,void>
            ((unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>> *)this,
             (unique_ptr<flow::lang::WhileStmt,_std::default_delete<flow::lang::WhileStmt>_> *)
             local_a0);
  std::unique_ptr<flow::lang::WhileStmt,_std::default_delete<flow::lang::WhileStmt>_>::~unique_ptr
            ((unique_ptr<flow::lang::WhileStmt,_std::default_delete<flow::lang::WhileStmt>_> *)
             local_a0);
  std::unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>::~unique_ptr(&local_70);
  std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::~unique_ptr
            ((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)&body);
  SourceLocation::~SourceLocation((SourceLocation *)local_50);
  return (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)
         (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Stmt> Parser::whileStmt() {
  // whileStmt ::= 'while' expr stmt
  SourceLocation sloc(location());

  consume(Token::While);
  std::unique_ptr<Expr> cond = expr();
  std::unique_ptr<Stmt> body = stmt();

  if (!hasFeature(Feature::WhileLoop))
    report_.syntaxError(sloc, "While-loop feature not enabled.");

  return std::make_unique<WhileStmt>(sloc.update(end()), std::move(cond), std::move(body));
}